

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::BeginFunctionBody(SharedValidator *this,Location *loc,Index func_index)

{
  pointer *ppLVar1;
  pointer pLVar2;
  Type *pTVar3;
  iterator __position;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  Index IVar8;
  Result RVar9;
  pointer pFVar10;
  ulong uVar11;
  Type *pTVar12;
  TypeVector local_48;
  
  sVar5 = (loc->filename)._M_len;
  pcVar6 = (loc->filename)._M_str;
  uVar7 = *(undefined8 *)((long)&loc->field_1 + 8);
  (this->expr_loc_).field_1.field_1.offset = (loc->field_1).field_1.offset;
  *(undefined8 *)((long)&(this->expr_loc_).field_1 + 8) = uVar7;
  (this->expr_loc_).filename._M_len = sVar5;
  (this->expr_loc_).filename._M_str = pcVar6;
  pLVar2 = (this->locals_).
           super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->locals_).
      super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar2) {
    (this->locals_).
    super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar2;
  }
  uVar4 = (ulong)func_index;
  pFVar10 = (this->funcs_).
            super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((long)(this->funcs_).
                  super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar10 >> 3) *
           0x6db6db6db6db6db7;
  if (uVar11 < uVar4 || uVar11 - uVar4 == 0) {
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar9 = TypeChecker::BeginFunction(&this->typechecker_,&local_48);
    if ((Type)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
              super__Vector_impl_data._M_start != (Type)0x0) {
      operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pTVar12 = *(Type **)&pFVar10[uVar4].params.
                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl;
    pTVar3 = *(pointer *)
              ((long)&pFVar10[uVar4].params.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl + 8);
    if (pTVar12 != pTVar3) {
      do {
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)pTVar12;
        __position._M_current =
             (this->locals_).
             super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if ((this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_start == __position._M_current) {
          IVar8 = 1;
        }
        else {
          IVar8 = __position._M_current[-1].end + 1;
        }
        local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,IVar8);
        if (__position._M_current ==
            (this->locals_).
            super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
          ::_M_realloc_insert<wabt::SharedValidator::LocalDecl>
                    (&this->locals_,__position,(LocalDecl *)&local_48);
        }
        else {
          (__position._M_current)->end = IVar8;
          (__position._M_current)->type =
               (Type)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppLVar1 = &(this->locals_).
                     super__Vector_base<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        pTVar12 = pTVar12 + 1;
      } while (pTVar12 != pTVar3);
      pFVar10 = (this->funcs_).
                super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    RVar9 = TypeChecker::BeginFunction(&this->typechecker_,&pFVar10[uVar4].results);
  }
  return (Result)RVar9.enum_;
}

Assistant:

Result SharedValidator::BeginFunctionBody(const Location& loc,
                                          Index func_index) {
  expr_loc_ = loc;
  locals_.clear();
  if (func_index < funcs_.size()) {
    for (Type type : funcs_[func_index].params) {
      // TODO: Coalesce parameters of the same type?
      locals_.push_back(LocalDecl{type, GetLocalCount() + 1});
    }
    return typechecker_.BeginFunction(funcs_[func_index].results);
  } else {
    // Signature isn't available, use empty.
    return typechecker_.BeginFunction(TypeVector());
  }
}